

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

char * __thiscall gl4cts::anon_unknown_0::LinkFailure::VertexShader_prop(LinkFailure *this)

{
  return 
  "#version 430                         \nin vec4 posit;                       \nin vec4 p;                           \nvoid main(void)                      \n{                                    \n    gl_Position = p + posit;         \n}"
  ;
}

Assistant:

virtual const char* VertexShader_prop()
	{
		return "#version 430                         \n"
			   "in vec4 posit;                       \n"
			   "in vec4 p;                           \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = p + posit;         \n"
			   "}";
	}